

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ProgressBar::setValue(ProgressBar *this,int value)

{
  bool bVar1;
  ProgressBarPrivate *pPVar2;
  QVariant local_78;
  QAccessibleValueChangeEvent local_58 [8];
  QAccessibleValueChangeEvent event;
  int value_local;
  ProgressBar *this_local;
  
  pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
           ::operator->(&this->d);
  if (value == pPVar2->minimum + -1) {
    reset(this);
  }
  else {
    pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
             ::operator->(&this->d);
    if ((pPVar2->value != value) &&
       (((pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
                   ::operator->(&this->d), value <= pPVar2->maximum &&
         (pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
                   ::operator->(&this->d), pPVar2->minimum <= value)) ||
        ((pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
                   ::operator->(&this->d), pPVar2->maximum == 0 &&
         (pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
                   ::operator->(&this->d), pPVar2->minimum == 0)))))) {
      pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
               ::operator->(&this->d);
      pPVar2->value = value;
      valueChanged(this,value);
      bVar1 = QWidget::isVisible(&this->super_QWidget);
      if (bVar1) {
        QVariant::QVariant(&local_78,value);
        QAccessibleValueChangeEvent::QAccessibleValueChangeEvent(local_58,(QObject *)this,&local_78)
        ;
        QVariant::~QVariant(&local_78);
        QAccessible::updateAccessibility((QAccessibleEvent *)local_58);
        QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent(local_58);
      }
      pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
               ::operator->(&this->d);
      bVar1 = ProgressBarPrivate::repaintRequired(pPVar2);
      if (bVar1) {
        QWidget::repaint();
      }
      pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
               ::operator->(&this->d);
      if ((pPVar2->animate & 1U) != 0) {
        pPVar2 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
                 ::operator->(&this->d);
        pPVar2->animate = false;
        QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
        ::operator->(&this->d);
        QAbstractAnimation::stop();
        QWidget::repaint();
      }
    }
  }
  return;
}

Assistant:

void
ProgressBar::setValue( int value )
{
	if( value == d->minimum - 1 )
	{
		reset();

		return;
	}

	if( d->value == value
		|| ( ( value > d->maximum || value < d->minimum )
			&& ( d->maximum != 0 || d->minimum != 0 ) ) )
		return;

	d->value = value;

	emit valueChanged( value );

#ifndef QT_NO_ACCESSIBILITY
	if( isVisible() )
	{
		QAccessibleValueChangeEvent event( this, value );
		QAccessible::updateAccessibility( &event );
	}
#endif

	if( d->repaintRequired() )
		repaint();

	if( d->animate )
	{
		d->animate = false;

		d->animation->stop();

		repaint();
	}
}